

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int subjournalPageIfRequired(PgHdr *pPg)

{
  int iVar1;
  PgHdr *pPg_local;
  
  iVar1 = subjRequiresPage(pPg);
  if (iVar1 == 0) {
    pPg_local._4_4_ = 0;
  }
  else {
    pPg_local._4_4_ = subjournalPage(pPg);
  }
  return pPg_local._4_4_;
}

Assistant:

static int subjournalPageIfRequired(PgHdr *pPg){
  if( subjRequiresPage(pPg) ){
    return subjournalPage(pPg);
  }else{
    return SQLITE_OK;
  }
}